

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.c
# Opt level: O1

void worker(void *arg)

{
  int line;
  int iVar1;
  int in_ECX;
  int in_EDX;
  int sock;
  int in_ESI;
  char buf [3];
  undefined1 local_b [3];
  
  line = test_socket_impl((char *)0x24,in_ESI,in_EDX,in_ECX);
  iVar1 = nn_recv(line,local_b,3,0);
  if (iVar1 == -1) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      iVar1 = nn_recv(line,local_b,3,0);
      if (iVar1 == -1) {
        iVar1 = nn_errno();
        if (iVar1 == 0x9523dfd) {
          test_close_impl((char *)0x2e,line,sock);
          return;
        }
      }
      goto LAB_001017bd;
    }
  }
  worker_cold_1();
LAB_001017bd:
  worker_cold_2();
}

Assistant:

static void worker (NN_UNUSED void *arg)
{
    int rc;
    int s;
    char buf [3];

    /*  Test socket. */
    s = test_socket (AF_SP, NN_PAIR);

    /*  Launch blocking function to check that it will be unblocked once
        nn_term() is called from the main thread. */
    rc = nn_recv (s, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == ETERM);

    /*  Check that all subsequent operations fail in synchronous manner. */
    rc = nn_recv (s, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == ETERM);
    test_close (s);
}